

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::TestIiv
          (ParameterSetupErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar13;
  GLint min_filter_invalid;
  GLint wrap_invalid;
  GLint minus_one;
  GLint one;
  GLint depth_stencil_mode_invalid;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  GLenum local_34;
  long lVar12;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar11);
  local_38 = 1;
  local_3c = 0xffffffff;
  local_34 = this->m_depth_stencil_mode_invalid;
  local_40 = 0x8743;
  local_44 = 0x2700;
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1408))(pEVar13,this->m_pname_invalid,&local_38);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterIiv",
                     "pname is not one of the accepted defined values.");
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x90ea,&local_34);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterIiv",
                     "params should have a defined constant value (based on the value of pname) and does not."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x8501,&local_38);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterIiv",
                     "the  effective target is either TEXTURE_2D_MULTISAMPLE or  TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x2802,&local_40);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterIiv",
                     "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x2801,&local_44);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureParameterIiv",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a value other than NEAREST or LINEAR (no mipmap filtering is permitted)."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x813c,&local_38);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureParameterIiv",
                     "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a value other than zero."
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x8501,&local_38);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureParameterIiv",
                     "texture is not the name of an existing texture object.");
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x813c,&local_38);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureParameterIiv",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to any value other than zero. "
                    );
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x813c,&local_3c);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureParameterIiv",
                     "pname is TEXTURE_BASE_LEVEL and param is negative.");
  pEVar13 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar12 + 0x1408))(pEVar13,0x813d,&local_3c);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureParameterIiv",
                      "pname is TEXTURE_MAX_LEVEL and param is negative.");
  return (bVar10 && (bVar9 && bVar8)) &&
         ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool ParameterSetupErrorsTest::TestIiv()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	glw::GLint one						  = 1;
	glw::GLint minus_one				  = -1;
	glw::GLint depth_stencil_mode_invalid = (glw::GLint)m_depth_stencil_mode_invalid;
	glw::GLint wrap_invalid				  = (glw::GLint)GL_MIRROR_CLAMP_TO_EDGE;
	glw::GLint min_filter_invalid		  = (glw::GLint)GL_NEAREST_MIPMAP_NEAREST;

	/* Check that INVALID_ENUM is generated by TextureParameter* if pname is
	 not one of the accepted defined values. */
	{
		gl.textureParameterIiv(m_to_2D, m_pname_invalid, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIiv",
								  "pname is not one of the accepted defined values.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if params
	 should have a defined constant value (based on the value of pname) and
	 does not. */
	{
		gl.textureParameterIiv(m_to_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &depth_stencil_mode_invalid);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIiv",
							 "params should have a defined constant value (based on the value of pname) and does not.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states. */
	{
		gl.textureParameterIiv(m_to_2D_ms, GL_TEXTURE_LOD_BIAS, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIiv",
								  "the  effective target is either TEXTURE_2D_MULTISAMPLE or  "
								  "TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and either of pnames
	 TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE,
	 MIRRORED_REPEAT or REPEAT. */
	{
		gl.textureParameterIiv(m_to_rectangle, GL_TEXTURE_WRAP_S, &wrap_invalid);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIiv",
								  "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or "
								  "TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is
	 set to a value other than NEAREST or LINEAR (no mipmap filtering is
	 permitted). */
	{
		gl.textureParameterIiv(m_to_rectangle, GL_TEXTURE_MIN_FILTER, &min_filter_invalid);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIiv",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a "
								  "value other than NEAREST or LINEAR (no mipmap filtering is permitted).");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a
	 value other than zero. */
	{
		gl.textureParameterIiv(m_to_2D_ms, GL_TEXTURE_BASE_LEVEL, &one);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterIiv",
							 "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, "
							 "and pname TEXTURE_BASE_LEVEL is set to a value other than zero.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if
	 texture is not the name of an existing texture object. */
	{
		gl.textureParameterIiv(m_to_invalid, GL_TEXTURE_LOD_BIAS, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterIiv",
								  "texture is not the name of an existing texture object.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is
	 set to any value other than zero. */
	{
		gl.textureParameterIiv(m_to_rectangle, GL_TEXTURE_BASE_LEVEL, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterIiv",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to "
								  "any value other than zero. ");
	}

	/* Check that INVALID_VALUE is generated by TextureParameter* if pname is
	 TEXTURE_BASE_LEVEL or TEXTURE_MAX_LEVEL, and param or params is
	 negative. */
	{
		gl.textureParameterIiv(m_to_2D, GL_TEXTURE_BASE_LEVEL, &minus_one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameterIiv",
								  "pname is TEXTURE_BASE_LEVEL and param is negative.");

		gl.textureParameterIiv(m_to_2D, GL_TEXTURE_MAX_LEVEL, &minus_one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameterIiv",
								  "pname is TEXTURE_MAX_LEVEL and param is negative.");
	}

	return is_ok;
}